

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O2

void __thiscall
ProblemAloha::splitState(ProblemAloha *this,Index sI,Index *backlog,Index *newPacket)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> splitS;
  
  IndexTools::JointToIndividualIndicesStepSize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &splitS.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,sI,
             this->_m_stepSizeState,2);
  *backlog = *splitS.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  *newPacket = splitS.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[1];
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&splitS.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void
ProblemAloha::splitState(Index sI, Index &backlog, Index &newPacket) const
{
    vector<Index> splitS=
        IndexTools::JointToIndividualIndicesStepSize(sI,_m_stepSizeState,2);
    backlog=splitS[0];
    newPacket=splitS[1];
}